

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
          (cmGeneratorTarget *this,string *p,string *config)

{
  TargetType TVar1;
  CompatibleInterfacesBase *this_00;
  const_iterator cVar2;
  
  TVar1 = cmTarget::GetType(this->Target);
  if ((TVar1 != OBJECT_LIBRARY) &&
     (TVar1 = cmTarget::GetType(this->Target), TVar1 != INTERFACE_LIBRARY)) {
    this_00 = GetCompatibleInterfaces(this,config);
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this_00,p);
    return (_Rb_tree_header *)cVar2._M_node !=
           &(this_00->PropsBool)._M_t._M_impl.super__Rb_tree_header;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty(
  const std::string& p, const std::string& config) const
{
  if (this->GetType() == cmStateEnums::OBJECT_LIBRARY ||
      this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return false;
  }
  return this->GetCompatibleInterfaces(config).PropsBool.count(p) > 0;
}